

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O1

void __thiscall
glcts::ArraysOfArrays::InteractionArgumentAliasing3<glcts::ArraysOfArrays::Interface::GL>::
test_shader_compilation
          (InteractionArgumentAliasing3<glcts::ArraysOfArrays::Interface::GL> *this,
          TestShaderType tested_shader_type)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  int iVar1;
  long lVar2;
  long lVar3;
  long *plVar4;
  TestError *this_00;
  size_type *psVar5;
  long lVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string verification;
  string function_use;
  string array_declaration;
  string iteration_loop_end;
  string function_definition;
  string iteration_loop_start;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  string local_120;
  string local_100;
  InteractionArgumentAliasing3<glcts::ArraysOfArrays::Interface::GL> *local_e0;
  TestShaderType local_d4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  local_e0 = this;
  local_d4 = tested_shader_type;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_90,
             "                               }\n                           }\n                        }\n                    }\n                }\n            }\n        }\n    }\n"
             ,"");
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,
             "    for (uint a = 0u; a < 2u; a++)\n    {\n        for (uint b = 0u; b < 2u; b++)\n        {\n            for (uint c = 0u; c < 2u; c++)\n            {\n                for (uint d = 0u; d < 2u; d++)\n                {\n                    for (uint e = 0u; e < 2u; e++)\n                    {\n                        for (uint f = 0u; f < 2u; f++)\n                        {\n                           for (uint g = 0u; g < 2u; g++)\n                           {\n                               for (uint h = 0u; h < 2u; h++)\n                               {\n"
             ,"");
  lVar6 = 0;
  do {
    lVar2 = 0x222cb38;
    if (supported_variable_types_map._16_8_ != 0) {
      lVar2 = 0x222cb38;
      lVar3 = supported_variable_types_map._16_8_;
      do {
        if ((int)test_shader_compilation::var_types_set_gl[lVar6] <= *(int *)(lVar3 + 0x20)) {
          lVar2 = lVar3;
        }
        lVar3 = *(long *)(lVar3 + 0x10 +
                         (ulong)(*(int *)(lVar3 + 0x20) <
                                (int)test_shader_compilation::var_types_set_gl[lVar6]) * 8);
      } while (lVar3 != 0);
    }
    lVar3 = 0x222cb38;
    if ((lVar2 != 0x222cb38) &&
       (lVar3 = lVar2,
       (int)test_shader_compilation::var_types_set_gl[lVar6] < *(int *)(lVar2 + 0x20))) {
      lVar3 = 0x222cb38;
    }
    if (lVar3 == 0x222cb38) {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Type not found.",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                 ,0x1654);
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b0,*(long *)(lVar3 + 0x28),
               *(long *)(lVar3 + 0x30) + *(long *)(lVar3 + 0x28));
    std::__cxx11::string::append((char *)&local_b0);
    __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(lVar3 + 0x28);
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    local_70._M_string_length = 0;
    local_70.field_2._M_local_buf[0] = '\0';
    local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
    local_100._M_string_length = 0;
    local_100.field_2._M_local_buf[0] = '\0';
    local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
    local_120._M_string_length = 0;
    local_120.field_2._M_local_buf[0] = '\0';
    std::operator+(&local_d0,"bool gfunc(out ",__rhs);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_d0);
    local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
    psVar5 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_140.field_2._M_allocated_capacity = *psVar5;
      local_140.field_2._8_8_ = plVar4[3];
    }
    else {
      local_140.field_2._M_allocated_capacity = *psVar5;
      local_140._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_140._M_string_length = plVar4[1];
    *plVar4 = (long)psVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_140._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != &local_140.field_2) {
      operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_140,*(long *)(lVar3 + 0x28),
               *(long *)(lVar3 + 0x30) + *(long *)(lVar3 + 0x28));
    std::__cxx11::string::append((char *)&local_140);
    std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_140._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != &local_140.field_2) {
      operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::append((char *)&local_70);
    std::operator+(&local_140,"    ",&local_50);
    std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_140._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != &local_140.field_2) {
      operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
    }
    std::operator+(&local_d0,"                                   x[a][b][c][d][e][f][g][h] = ",__rhs
                  );
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_d0);
    local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
    psVar5 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_140.field_2._M_allocated_capacity = *psVar5;
      local_140.field_2._8_8_ = plVar4[3];
    }
    else {
      local_140.field_2._M_allocated_capacity = *psVar5;
      local_140._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_140._M_string_length = plVar4[1];
    *plVar4 = (long)psVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_140._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != &local_140.field_2) {
      operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    std::operator+(&local_140,"    ",&local_90);
    std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_140._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != &local_140.field_2) {
      operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::append((char *)&local_70);
    std::operator+(&local_140,"    ",&local_50);
    std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_140._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != &local_140.field_2) {
      operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::append((char *)&local_70);
    iVar1 = std::__cxx11::string::compare((char *)__rhs);
    if (iVar1 == 0) {
      std::__cxx11::string::append((char *)&local_70);
LAB_00b68cea:
      std::__cxx11::string::append((char *)&local_70);
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)__rhs);
      if (iVar1 == 0) {
        std::__cxx11::string::append((char *)&local_70);
        goto LAB_00b68cea;
      }
      std::__cxx11::string::append((char *)&local_70);
      std::__cxx11::string::_M_append((char *)&local_70,*(ulong *)(lVar3 + 0x28));
    }
    std::__cxx11::string::append((char *)&local_70);
    std::operator+(&local_140,"    ",&local_90);
    std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_140._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != &local_140.field_2) {
      operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::append((char *)&local_70);
    std::__cxx11::string::append((char *)&local_70);
    std::operator+(&local_140,"    ",&local_b0);
    std::__cxx11::string::_M_append((char *)&local_100,(ulong)local_140._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != &local_140.field_2) {
      operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
    }
    std::operator+(&local_140,"    ",&local_50);
    std::__cxx11::string::_M_append((char *)&local_100,(ulong)local_140._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != &local_140.field_2) {
      operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::append((char *)&local_100);
    std::__cxx11::string::_M_append((char *)&local_100,*(ulong *)(lVar3 + 0x28));
    std::__cxx11::string::append((char *)&local_100);
    std::operator+(&local_140,"    ",&local_90);
    std::__cxx11::string::_M_append((char *)&local_100,(ulong)local_140._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != &local_140.field_2) {
      operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::append((char *)&local_120);
    std::__cxx11::string::append((char *)&local_120);
    std::__cxx11::string::append((char *)&local_120);
    std::__cxx11::string::append((char *)&local_120);
    std::__cxx11::string::append((char *)&local_120);
    std::__cxx11::string::append((char *)&local_120);
    std::__cxx11::string::append((char *)&local_120);
    std::__cxx11::string::append((char *)&local_120);
    std::__cxx11::string::append((char *)&local_120);
    if (local_d4 == COMPUTE_SHADER_TYPE) {
      InteractionFunctionCalls1<glcts::ArraysOfArrays::Interface::GL>::execute_dispatch_test
                (&local_e0->super_InteractionFunctionCalls1<glcts::ArraysOfArrays::Interface::GL>,
                 COMPUTE_SHADER_TYPE,&local_70,&local_100,&local_120);
    }
    else {
      InteractionFunctionCalls1<glcts::ArraysOfArrays::Interface::GL>::execute_draw_test
                (&local_e0->super_InteractionFunctionCalls1<glcts::ArraysOfArrays::Interface::GL>,
                 local_d4,&local_70,&local_100,&local_120);
    }
    (*(local_e0->super_InteractionFunctionCalls1<glcts::ArraysOfArrays::Interface::GL>).
      super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>.super_TestCase.super_TestNode.
      _vptr_TestNode[5])();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != &local_120.field_2) {
      operator_delete(local_120._M_dataplus._M_p,
                      CONCAT71(local_120.field_2._M_allocated_capacity._1_7_,
                               local_120.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != &local_100.field_2) {
      operator_delete(local_100._M_dataplus._M_p,
                      CONCAT71(local_100.field_2._M_allocated_capacity._1_7_,
                               local_100.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,
                      CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                               local_70.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    lVar6 = lVar6 + 1;
    if (lVar6 == 5) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      return;
    }
  } while( true );
}

Assistant:

void InteractionArgumentAliasing3<API>::test_shader_compilation(
	typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	static const glcts::test_var_type var_types_set_es[] = { VAR_TYPE_INT, VAR_TYPE_FLOAT, VAR_TYPE_MAT4 };
	static const size_t				  num_var_types_es   = sizeof(var_types_set_es) / sizeof(var_types_set_es[0]);

	static const glcts::test_var_type var_types_set_gl[] = { VAR_TYPE_INT, VAR_TYPE_FLOAT, VAR_TYPE_MAT4,
															 VAR_TYPE_DOUBLE, VAR_TYPE_DMAT4 };
	static const size_t num_var_types_gl = sizeof(var_types_set_gl) / sizeof(var_types_set_gl[0]);

	const std::string iteration_loop_end = "                               }\n"
										   "                           }\n"
										   "                        }\n"
										   "                    }\n"
										   "                }\n"
										   "            }\n"
										   "        }\n"
										   "    }\n";
	const std::string iteration_loop_start = "    for (uint a = 0u; a < 2u; a++)\n"
											 "    {\n"
											 "        for (uint b = 0u; b < 2u; b++)\n"
											 "        {\n"
											 "            for (uint c = 0u; c < 2u; c++)\n"
											 "            {\n"
											 "                for (uint d = 0u; d < 2u; d++)\n"
											 "                {\n"
											 "                    for (uint e = 0u; e < 2u; e++)\n"
											 "                    {\n"
											 "                        for (uint f = 0u; f < 2u; f++)\n"
											 "                        {\n"
											 "                           for (uint g = 0u; g < 2u; g++)\n"
											 "                           {\n"
											 "                               for (uint h = 0u; h < 2u; h++)\n"
											 "                               {\n";
	const glcts::test_var_type* var_types_set = var_types_set_es;
	size_t						num_var_types = num_var_types_es;
	const bool					test_compute  = (TestCaseBase<API>::COMPUTE_SHADER_TYPE == tested_shader_type);

	if (API::USE_DOUBLE)
	{
		var_types_set = var_types_set_gl;
		num_var_types = num_var_types_gl;
	}

	for (size_t var_type_index = 0; var_type_index < num_var_types; var_type_index++)
	{
		_supported_variable_types_map_const_iterator var_iterator =
			supported_variable_types_map.find(var_types_set[var_type_index]);

		if (var_iterator != supported_variable_types_map.end())
		{
			std::string array_declaration = var_iterator->second.type + " z[2][2][2][2][2][2][2][2];\n\n";

			std::string function_definition;
			std::string function_use;
			std::string verification;

			function_definition += "bool gfunc(out " + var_iterator->second.type + " x[2][2][2][2][2][2][2][2], ";
			function_definition += var_iterator->second.type + " y[2][2][2][2][2][2][2][2])\n";
			function_definition += "{\n";
			function_definition += "    " + iteration_loop_start;
			function_definition +=
				"                                   x[a][b][c][d][e][f][g][h] = " + var_iterator->second.type +
				"(123);\n";
			function_definition += "    " + iteration_loop_end;
			function_definition += "\n";
			function_definition += "    " + iteration_loop_start;
			function_definition += "                                   if(y[a][b][c][d][e][f][g][h]";
			if (var_iterator->second.type == "mat4") // mat4 comparison
			{
				function_definition += "[0][0]";
				function_definition += " != float";
			}
			else if (var_iterator->second.type == "dmat4") // dmat4 comparison
			{
				function_definition += "[0][0]";
				function_definition += " != double";
			}
			else
			{
				function_definition += " != ";
				function_definition += var_iterator->second.type;
			}
			function_definition += "(((a*128u)+(b*64u)+(c*32u)+(d*16u)+(e*8u)+(f*4u)+(g*2u)+h))) {return false;}\n";
			function_definition += "    " + iteration_loop_end;
			function_definition += "  return true;\n";
			function_definition += "}\n\n";

			function_use += "    " + array_declaration;
			function_use += "    " + iteration_loop_start;
			function_use += "                                   z[a][b][c][d][e][f][g][h] = ";
			function_use += var_iterator->second.type;
			function_use += "(((a*128u)+(b*64u)+(c*32u)+(d*16u)+(e*8u)+(f*4u)+(g*2u)+h));\n";
			function_use += "    " + iteration_loop_end;

			verification += "    float result = 0.0;\n";
			verification += "    if(gfunc(z, z) == true)\n";
			verification += "    {\n";
			verification += "        result = 1.0;\n\n";
			verification += "    }\n";
			verification += "    else\n";
			verification += "    {\n";
			verification += "        result = 0.0;\n\n";
			verification += "    }\n";

			if (false == test_compute)
			{
				this->execute_draw_test(tested_shader_type, function_definition, function_use, verification);
			}
			else
			{
				this->execute_dispatch_test(tested_shader_type, function_definition, function_use, verification);
			}

			/* Deallocate any resources used. */
			this->delete_objects();
		} /* if var_type iterator found */
		else
		{
			TCU_FAIL("Type not found.");
		}
	}
}